

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_sse4.c
# Opt level: O0

void av1_get_horver_correlation_full_sse4_1
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int in_ECX;
  int iVar5;
  longlong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  ulong in_RSI;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  float xz_var_n;
  float xy_var_n;
  float z_var_n;
  float y_var_n;
  float xver_var_n;
  float xhor_var_n;
  float num_ver;
  float num_hor;
  int64_t z2_sum;
  int64_t y2_sum;
  int64_t x2ver_sum;
  int64_t x2hor_sum;
  int64_t z_sum;
  int64_t y_sum;
  int64_t xver_sum;
  int64_t xhor_sum;
  int i_3;
  int j_3;
  int64_t x2_firstcol;
  int64_t x2_firstrow;
  int64_t x_firstcol;
  int64_t x_firstrow;
  int16_t w_1;
  int16_t z_2;
  int16_t y_2;
  int16_t x_3;
  int i_2;
  int16_t y0;
  int16_t x0_3;
  int16_t z_1;
  int16_t x_2;
  int i_1;
  int16_t x0_2;
  int16_t w;
  int16_t z;
  int16_t y_1;
  int16_t x_1;
  int j_2;
  int16_t z0;
  int16_t x0_1;
  int16_t y;
  int16_t x;
  int j_1;
  int16_t x0;
  int64_t x2_finalcol;
  int64_t x2_finalrow;
  int64_t x_finalcol;
  int64_t x_finalrow;
  int j;
  int i;
  __m128i x2_sum_32;
  __m128i x_sum_32;
  __m128i xz_sum_32;
  __m128i xy_sum_32;
  int32_t x2_tmp [4];
  int32_t x_tmp [4];
  int32_t xz_tmp [4];
  int32_t xy_tmp [4];
  int64_t x2_sum;
  int64_t x_sum;
  int64_t xz_sum;
  int64_t xy_sum;
  float local_258;
  float local_250;
  int local_1e0;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  int local_1b0;
  int local_1a4;
  int local_194;
  int local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  int local_160;
  int local_15c;
  __m128i *x2_sum_32_00;
  __m128i *x_sum_32_00;
  __m128i *xz_sum_32_00;
  __m128i *xy_sum_32_00;
  undefined8 uVar14;
  int16_t *diff_00;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  float *local_b0;
  float *local_a8;
  int local_9c;
  int local_98;
  uint local_94;
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_94 = (uint)in_RSI;
  local_98 = (int)in_RDX;
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_15c = 0;
  local_b0 = in_R9;
  local_a8 = in_R8;
  local_9c = in_ECX;
  local_90 = in_RDI;
  while( true ) {
    diff_00 = (int16_t *)0x0;
    uVar14 = 0;
    xy_sum_32_00 = (__m128i *)0x0;
    xz_sum_32_00 = (__m128i *)0x0;
    x_sum_32_00 = (__m128i *)0x0;
    x2_sum_32_00 = (__m128i *)0x0;
    if (local_9c + -4 < local_15c) break;
    for (local_160 = 0; local_160 <= local_98 + -4; local_160 = local_160 + 3) {
      in_RSI = (ulong)local_94;
      horver_correlation_4x4
                (diff_00,(int)((ulong)uVar14 >> 0x20),xy_sum_32_00,xz_sum_32_00,x_sum_32_00,
                 x2_sum_32_00);
      in_RDX = extraout_RDX;
    }
    v[1] = in_RDX;
    v[0] = in_RSI;
    xx_storeu_128(&local_e8,v);
    v_00[1] = extraout_RDX_00;
    v_00[0] = in_RSI;
    xx_storeu_128(&local_f8,v_00);
    v_01[1] = extraout_RDX_01;
    v_01[0] = in_RSI;
    xx_storeu_128(&local_108,v_01);
    v_02[1] = extraout_RDX_02;
    v_02[0] = in_RSI;
    xx_storeu_128(&local_118,v_02);
    local_b8 = local_b8 + (long)uStack_e0._4_4_ + (long)(int)uStack_e0 + (long)local_e8._4_4_;
    local_c0 = local_c0 + (long)uStack_f0._4_4_ + (long)(int)uStack_f0 + (long)(int)local_f8;
    local_c8 = local_c8 +
               (long)uStack_100._4_4_ + (long)(int)uStack_100 + (long)local_108._4_4_ +
               (long)(int)local_108;
    local_d0 = local_d0 + (long)(int)uStack_110 + (long)local_118._4_4_ + (long)(int)local_118;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_15c = local_15c + 3;
    in_RDX = extraout_RDX_03;
  }
  if (local_9c % 3 == 1) {
    sVar1 = *(short *)(local_90 + (long)(int)((local_9c + -1) * local_94) * 2);
    local_c8 = sVar1 + local_c8;
    local_168 = (long)sVar1;
    local_d0 = (int)sVar1 * (int)sVar1 + local_d0;
    local_178 = (long)((int)sVar1 * (int)sVar1);
    for (local_188 = 0; local_188 < local_98 + -1; local_188 = local_188 + 1) {
      sVar1 = *(short *)(local_90 + (long)(int)((local_9c + -1) * local_94 + local_188 + 1) * 2);
      local_b8 = (int)*(short *)(local_90 + (long)(int)((local_9c + -1) * local_94 + local_188) * 2)
                 * (int)sVar1 + local_b8;
      local_c8 = sVar1 + local_c8;
      local_d0 = (int)sVar1 * (int)sVar1 + local_d0;
      local_168 = sVar1 + local_168;
      local_178 = (int)sVar1 * (int)sVar1 + local_178;
    }
  }
  else {
    sVar1 = *(short *)(local_90 + (long)(int)((local_9c + -2) * local_94) * 2);
    sVar2 = *(short *)(local_90 + (long)(int)((local_9c + -1) * local_94) * 2);
    local_c8 = ((int)sVar1 + (int)sVar2) + local_c8;
    local_d0 = ((int)sVar1 * (int)sVar1 + (int)sVar2 * (int)sVar2) + local_d0;
    local_168 = (long)sVar2;
    local_178 = (long)((int)sVar2 * (int)sVar2);
    for (local_194 = 0; local_194 < local_98 + -1; local_194 = local_194 + 1) {
      sVar1 = *(short *)(local_90 + (long)(int)((local_9c + -2) * local_94 + local_194) * 2);
      sVar2 = *(short *)(local_90 + (long)(int)((local_9c + -2) * local_94 + local_194 + 1) * 2);
      sVar3 = *(short *)(local_90 + (long)(int)((local_9c + -1) * local_94 + local_194) * 2);
      sVar4 = *(short *)(local_90 + (long)(int)((local_9c + -1) * local_94 + local_194 + 1) * 2);
      local_c0 = (int)sVar1 * (int)sVar3 + local_c0;
      local_b8 = (long)((int)sVar3 * (int)sVar4) + (int)sVar1 * (int)sVar2 + local_b8;
      local_c8 = ((int)sVar2 + (int)sVar4) + local_c8;
      local_d0 = ((int)sVar2 * (int)sVar2 + (int)sVar4 * (int)sVar4) + local_d0;
      local_168 = sVar4 + local_168;
      local_178 = (int)sVar4 * (int)sVar4 + local_178;
    }
  }
  if (local_98 % 3 == 1) {
    sVar1 = *(short *)(local_90 + (long)(local_98 + -1) * 2);
    local_c8 = sVar1 + local_c8;
    local_170 = (long)sVar1;
    local_d0 = (int)sVar1 * (int)sVar1 + local_d0;
    local_180 = (long)((int)sVar1 * (int)sVar1);
    for (local_1a4 = 0; local_1a4 < local_9c + -1; local_1a4 = local_1a4 + 1) {
      sVar1 = *(short *)(local_90 + (long)(int)((local_1a4 + 1) * local_94 + local_98 + -1) * 2);
      local_c0 = (int)*(short *)(local_90 + (long)(int)(local_1a4 * local_94 + local_98 + -1) * 2) *
                 (int)sVar1 + local_c0;
      local_170 = sVar1 + local_170;
      local_180 = (int)sVar1 * (int)sVar1 + local_180;
      iVar5 = 3;
      if (local_9c % 3 == 1) {
        iVar5 = 2;
      }
      if (local_1a4 < local_9c - iVar5) {
        local_c8 = sVar1 + local_c8;
        local_d0 = (int)sVar1 * (int)sVar1 + local_d0;
      }
    }
  }
  else {
    sVar1 = *(short *)(local_90 + (long)(local_98 + -2) * 2);
    sVar2 = *(short *)(local_90 + (long)(local_98 + -1) * 2);
    local_c8 = ((int)sVar1 + (int)sVar2) + local_c8;
    local_d0 = ((int)sVar1 * (int)sVar1 + (int)sVar2 * (int)sVar2) + local_d0;
    local_170 = (long)sVar2;
    local_180 = (long)((int)sVar2 * (int)sVar2);
    for (local_1b0 = 0; local_1b0 < local_9c + -1; local_1b0 = local_1b0 + 1) {
      sVar1 = *(short *)(local_90 + (long)(int)(local_1b0 * local_94 + local_98 + -2) * 2);
      sVar2 = *(short *)(local_90 + (long)(int)(local_1b0 * local_94 + local_98 + -1) * 2);
      sVar3 = *(short *)(local_90 + (long)(int)((local_1b0 + 1) * local_94 + local_98 + -2) * 2);
      sVar4 = *(short *)(local_90 + (long)(int)((local_1b0 + 1) * local_94 + local_98 + -1) * 2);
      if ((local_1b0 < local_9c + -2) || (local_9c % 3 == 1)) {
        local_b8 = (int)sVar1 * (int)sVar2 + local_b8;
        local_c0 = (int)sVar1 * (int)sVar3 + local_c0;
      }
      local_170 = sVar4 + local_170;
      local_180 = (int)sVar4 * (int)sVar4 + local_180;
      iVar5 = 3;
      if (local_9c % 3 == 1) {
        iVar5 = 2;
      }
      if (local_1b0 < local_9c - iVar5) {
        local_c8 = ((int)sVar3 + (int)sVar4) + local_c8;
        local_d0 = ((int)sVar3 * (int)sVar3 + (int)sVar4 * (int)sVar4) + local_d0;
      }
      local_c0 = (int)sVar2 * (int)sVar4 + local_c0;
    }
  }
  local_1c0 = 0;
  local_1c8 = 0;
  local_1d0 = 0;
  local_1d8 = 0;
  for (local_1dc = 0; local_1dc < local_98; local_1dc = local_1dc + 1) {
    local_1c0 = *(short *)(local_90 + (long)local_1dc * 2) + local_1c0;
    local_1d0 = (int)*(short *)(local_90 + (long)local_1dc * 2) *
                (int)*(short *)(local_90 + (long)local_1dc * 2) + local_1d0;
  }
  for (local_1e0 = 0; local_1e0 < local_9c; local_1e0 = local_1e0 + 1) {
    local_1c8 = *(short *)(local_90 + (long)(int)(local_1e0 * local_94) * 2) + local_1c8;
    local_1d8 = (int)*(short *)(local_90 + (long)(int)(local_1e0 * local_94) * 2) *
                (int)*(short *)(local_90 + (long)(int)(local_1e0 * local_94) * 2) + local_1d8;
  }
  local_170 = local_c8 - local_170;
  local_168 = local_c8 - local_168;
  local_1c8 = local_c8 - local_1c8;
  local_1c0 = local_c8 - local_1c0;
  fVar6 = (float)(local_9c * (local_98 + -1));
  fVar7 = (float)((local_9c + -1) * local_98);
  fVar8 = (float)(local_d0 - local_180) - (float)(local_170 * local_170) / fVar6;
  fVar9 = (float)(local_d0 - local_178) - (float)(local_168 * local_168) / fVar7;
  fVar10 = (float)(local_d0 - local_1d8) - (float)(local_1c8 * local_1c8) / fVar6;
  fVar11 = (float)(local_d0 - local_1d0) - (float)(local_1c0 * local_1c0) / fVar7;
  fVar12 = (float)local_b8;
  fVar13 = (float)local_c0;
  if ((fVar8 <= 0.0) || (fVar10 <= 0.0)) {
    *local_a8 = 1.0;
  }
  else {
    fVar8 = sqrtf(fVar8 * fVar10);
    *local_a8 = (fVar12 - (float)(local_170 * local_1c8) / fVar6) / fVar8;
    if (0.0 < *local_a8 || *local_a8 == 0.0) {
      local_250 = *local_a8;
    }
    else {
      local_250 = 0.0;
    }
    *local_a8 = local_250;
  }
  if ((fVar9 <= 0.0) || (fVar11 <= 0.0)) {
    *local_b0 = 1.0;
  }
  else {
    fVar6 = sqrtf(fVar9 * fVar11);
    *local_b0 = (fVar13 - (float)(local_168 * local_1c0) / fVar7) / fVar6;
    if (0.0 < *local_b0 || *local_b0 == 0.0) {
      local_258 = *local_b0;
    }
    else {
      local_258 = 0.0;
    }
    *local_b0 = local_258;
  }
  return;
}

Assistant:

void av1_get_horver_correlation_full_sse4_1(const int16_t *diff, int stride,
                                            int width, int height, float *hcorr,
                                            float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_tmp[4] = { 0 }, xz_tmp[4] = { 0 };
  int32_t x_tmp[4] = { 0 }, x2_tmp[4] = { 0 };
  __m128i xy_sum_32 = _mm_setzero_si128();
  __m128i xz_sum_32 = _mm_setzero_si128();
  __m128i x_sum_32 = _mm_setzero_si128();
  __m128i x2_sum_32 = _mm_setzero_si128();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    xx_storeu_128(xy_tmp, xy_sum_32);
    xx_storeu_128(xz_tmp, xz_sum_32);
    xx_storeu_128(x_tmp, x_sum_32);
    xx_storeu_128(x2_tmp, x2_sum_32);
    xy_sum += (int64_t)xy_tmp[3] + xy_tmp[2] + xy_tmp[1];
    xz_sum += (int64_t)xz_tmp[3] + xz_tmp[2] + xz_tmp[0];
    x_sum += (int64_t)x_tmp[3] + x_tmp[2] + x_tmp[1] + x_tmp[0];
    x2_sum += (int64_t)x2_tmp[2] + x2_tmp[1] + x2_tmp[0];
    xy_sum_32 = _mm_setzero_si128();
    xz_sum_32 = _mm_setzero_si128();
    x_sum_32 = _mm_setzero_si128();
    x2_sum_32 = _mm_setzero_si128();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}